

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O2

int32_t ustrcase_mapWithOverlap_63
                  (int32_t caseLocale,uint32_t options,BreakIterator *iter,UChar *dest,
                  int32_t destCapacity,UChar *src,int32_t srcLength,
                  UStringCaseMapper *stringCaseMapper,UErrorCode *errorCode)

{
  int32_t iVar1;
  UChar *src_00;
  UChar buffer [300];
  
  iVar1 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((destCapacity < 0) ||
       ((src == (UChar *)0x0 || destCapacity != 0 && dest == (UChar *)0x0) || srcLength < -1)) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      iVar1 = 0;
    }
    else {
      if (srcLength == -1) {
        srcLength = u_strlen_63(src);
      }
      if (dest == (UChar *)0x0) {
        src_00 = (UChar *)0x0;
      }
      else if ((dest <= src && src < dest + (uint)destCapacity) ||
              (src_00 = dest, dest < src + srcLength && src <= dest)) {
        if ((uint)destCapacity < 0x12d) {
          src_00 = buffer;
        }
        else {
          src_00 = (UChar *)uprv_malloc_63((ulong)(uint)(destCapacity * 2));
          if (src_00 == (UChar *)0x0) {
            *errorCode = U_MEMORY_ALLOCATION_ERROR;
            return 0;
          }
        }
      }
      iVar1 = (*stringCaseMapper)(caseLocale,options,iter,src_00,destCapacity,src,srcLength,
                                  (Edits *)0x0,errorCode);
      if (src_00 != dest) {
        if (((iVar1 <= destCapacity) && (0 < iVar1)) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
          u_memmove_63(dest,src_00,iVar1);
        }
        if (src_00 != buffer) {
          uprv_free_63(src_00);
        }
      }
      iVar1 = u_terminateUChars_63(dest,destCapacity,iVar1,errorCode);
    }
  }
  return iVar1;
}

Assistant:

U_CFUNC int32_t
ustrcase_mapWithOverlap(int32_t caseLocale, uint32_t options, UCASEMAP_BREAK_ITERATOR_PARAM
                        UChar *dest, int32_t destCapacity,
                        const UChar *src, int32_t srcLength,
                        UStringCaseMapper *stringCaseMapper,
                        UErrorCode &errorCode) {
    UChar buffer[300];
    UChar *temp;

    int32_t destLength;

    /* check argument values */
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if( destCapacity<0 ||
        (dest==NULL && destCapacity>0) ||
        src==NULL ||
        srcLength<-1
    ) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* get the string length */
    if(srcLength==-1) {
        srcLength=u_strlen(src);
    }

    /* check for overlapping source and destination */
    if( dest!=NULL &&
        ((src>=dest && src<(dest+destCapacity)) ||
         (dest>=src && dest<(src+srcLength)))
    ) {
        /* overlap: provide a temporary destination buffer and later copy the result */
        if(destCapacity<=UPRV_LENGTHOF(buffer)) {
            /* the stack buffer is large enough */
            temp=buffer;
        } else {
            /* allocate a buffer */
            temp=(UChar *)uprv_malloc(destCapacity*U_SIZEOF_UCHAR);
            if(temp==NULL) {
                errorCode=U_MEMORY_ALLOCATION_ERROR;
                return 0;
            }
        }
    } else {
        temp=dest;
    }

    destLength=stringCaseMapper(caseLocale, options, UCASEMAP_BREAK_ITERATOR
                                temp, destCapacity, src, srcLength, NULL, errorCode);
    if(temp!=dest) {
        /* copy the result string to the destination buffer */
        if (U_SUCCESS(errorCode) && 0 < destLength && destLength <= destCapacity) {
            u_memmove(dest, temp, destLength);
        }
        if(temp!=buffer) {
            uprv_free(temp);
        }
    }

    return u_terminateUChars(dest, destCapacity, destLength, &errorCode);
}